

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableMatrixVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourcePropFlags targetProp)

{
  Context *context_00;
  TestNode *this;
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  ResourceTestCase *this_00;
  deInt32 *pdVar5;
  SharedPtr variable;
  SharedPtr unsized;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Context *local_48;
  TestNode *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  unsized.m_ptr = (Node *)&local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&unsized,0x96985f);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,targetProp,
             TYPE_FLOAT_MAT3X2,(string *)&unsized,2);
  local_40 = &targetGroup->super_TestNode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)unsized.m_ptr != &local_58) {
    operator_delete(unsized.m_ptr,local_58._M_allocated_capacity + 1);
  }
  local_48 = context;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar3 = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar1->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 0xfffffffe;
  unsized.m_state = (SharedPtrStateBase *)0x0;
  unsized.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  unsized.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 8;
  variable.m_state = (SharedPtrStateBase *)0x0;
  variable.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  variable.m_state = pSVar4;
  this_00 = (ResourceTestCase *)operator_new(0xb0);
  this = local_40;
  context_00 = local_48;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_BUFFER_VARIABLE,targetProp);
  ResourceTestCase::ResourceTestCase(this_00,context_00,&variable,&local_38,"var_unsized_array");
  tcu::TestNode::addChild(this,(TestNode *)this_00);
  pSVar2 = variable.m_state;
  pdVar5 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    variable.m_ptr = (Node *)0x0;
    (*(variable.m_state)->_vptr_SharedPtrStateBase[2])(variable.m_state);
  }
  LOCK();
  pdVar5 = &pSVar2->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if ((*pdVar5 == 0) && (variable.m_state != (SharedPtrStateBase *)0x0)) {
    (*(variable.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = unsized.m_state;
  if (unsized.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(unsized.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      unsized.m_ptr = (Node *)0x0;
      (*(unsized.m_state)->_vptr_SharedPtrStateBase[2])(unsized.m_state);
    }
    LOCK();
    pdVar5 = &pSVar2->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if ((*pdVar5 == 0) && (unsized.m_state != (SharedPtrStateBase *)0x0)) {
      (*(unsized.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferVariableMatrixVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, ProgramResourcePropFlags targetProp)
{
	// Basic aggregates
	generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp, glu::TYPE_FLOAT_MAT3X2, "", 2);

	// Unsized array
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		const ResourceDefinition::Node::SharedPtr	variable	(new ResourceDefinition::Variable(unsized, glu::TYPE_FLOAT_MAT3X2));

		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp), "var_unsized_array"));
	}
}